

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  WriteBarrierPtr<TestObject> *pWVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<TestObject> **ppWVar5;
  int local_20;
  int local_1c;
  int j;
  int index_local;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *list_local;
  CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  *this_local;
  
  if ((index < 0) ||
     ((list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_1c = index;
  for (local_20 = index + 1;
      local_20 < (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count;
      local_20 = local_20 + 1) {
    ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)
                         &(list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>
                          ).buffer);
    pWVar1 = *ppWVar5;
    ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)
                         &(list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>
                          ).buffer);
    Memory::WriteBarrierPtr<TestObject>::operator=(*ppWVar5 + local_1c,pWVar1 + local_20);
    local_1c = local_1c + 1;
  }
  (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count =
       (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count + -1;
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).
                        buffer);
  Memory::ClearArray<Memory::WriteBarrierPtr<TestObject>>
            (*ppWVar5 +
             (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count,1);
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }